

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

void p2sc_copy_file(char *from,char *to)

{
  int iVar1;
  GMappedFile *pGVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int *piVar6;
  char *fmt;
  GError *err;
  
  err = (GError *)0x0;
  pGVar2 = p2sc_map_file(from);
  pcVar3 = (char *)g_path_get_dirname(to);
  iVar1 = g_mkdir_with_parents(pcVar3,0x1ed);
  if (iVar1 == 0) {
    g_free(pcVar3);
    uVar4 = g_mapped_file_get_contents(pGVar2);
    uVar5 = g_mapped_file_get_length(pGVar2);
    iVar1 = g_file_set_contents(to,uVar4,uVar5,&err);
    if (iVar1 != 0) {
      g_mapped_file_unref(pGVar2);
      return;
    }
    if ((err == (GError *)0x0) || (pcVar3 = err->message, pcVar3 == (char *)0x0)) {
      fmt = "%s: file writing failed: unknown reason";
      iVar1 = 0x173;
      pcVar3 = to;
    }
    else {
      fmt = "%s";
      iVar1 = 0x170;
    }
  }
  else {
    piVar6 = __errno_location();
    g_strerror(*piVar6);
    fmt = "mkdir(%s): %s";
    iVar1 = 0x169;
  }
  _p2sc_msg("p2sc_copy_file",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,fmt,pcVar3);
  exit(1);
}

Assistant:

void p2sc_copy_file(const char *from, const char *to) {
    GError *err = NULL;
    GMappedFile *map = p2sc_map_file(from);

    char *dir = g_path_get_dirname(to);
    if (g_mkdir_with_parents(dir, 0755))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "mkdir(%s): %s", dir, g_strerror(errno));
    g_free(dir);

    if (!g_file_set_contents(to,
                             g_mapped_file_get_contents(map),
                             g_mapped_file_get_length(map), &err)) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s", err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: file writing failed: unknown reason", to);
    }
    g_mapped_file_unref(map);
}